

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

void __thiscall QPDFWriter::writeObjectStream(QPDFWriter *this,QPDFObjectHandle *object)

{
  int objid;
  int __val;
  QPDFObjGen *pQVar1;
  string *psVar2;
  long lVar3;
  Count *pCVar4;
  size_type sVar5;
  int *piVar6;
  undefined4 uVar7;
  bool bVar8;
  longlong *iter;
  QPDFObjGen og;
  Object *pOVar9;
  mapped_type *pmVar10;
  element_type *peVar11;
  NewObject *pNVar12;
  reference pvVar13;
  pointer plVar14;
  size_type *psVar15;
  QPDFObjGen *pQVar16;
  int __val_00;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view str_10;
  string_view str_11;
  string_view str_12;
  string_view str_13;
  string_view str_14;
  string_view str_15;
  string_view str_16;
  string_view str_17;
  string_view str_18;
  string_view str_19;
  string_view str_20;
  string_view str_21;
  PipelinePopper pp_ostream;
  QPDFObjectHandle obj_to_write;
  int local_158;
  vector<long_long,_std::allocator<long_long>_> offsets;
  undefined1 local_130 [20];
  int old_id;
  unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_118;
  QPDFObjectHandle extends;
  string stream_buffer_pass2;
  string stream_buffer_pass1;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_90;
  PipelinePopper pp_ostream_pass1;
  string local_70;
  size_t length;
  
  og = QPDFObjectHandle::getObjGen(object);
  if ((ulong)og >> 0x20 == 0) {
    old_id = og.obj;
    pOVar9 = ObjTable<QPDFWriter::Object>::operator[]
                       (&(((this->m).
                           super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->obj).super_ObjTable<QPDFWriter::Object>,og);
    objid = pOVar9->renumber;
    offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    stream_buffer_pass1._M_dataplus._M_p = (pointer)&stream_buffer_pass1.field_2;
    stream_buffer_pass1._M_string_length = 0;
    offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_130._16_4_ = 0;
    stream_buffer_pass1.field_2._M_local_buf[0] = '\0';
    stream_buffer_pass2._M_dataplus._M_p = (pointer)&stream_buffer_pass2.field_2;
    stream_buffer_pass2._M_string_length = 0;
    stream_buffer_pass2.field_2._M_local_buf[0] = '\0';
    peVar11 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar11->compress_streams == true) {
      local_130._16_4_ = peVar11->qdf_mode ^ 1;
    }
    pp_ostream_pass1.stack_id = 0;
    pp_ostream_pass1.qw = this;
    activatePipelineStack(this,&pp_ostream_pass1,&stream_buffer_pass1);
    pmVar10 = std::
              map<int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>_>_>
              ::operator[](&((this->m).
                             super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->object_stream_to_objects,&old_id);
    pQVar1 = (pmVar10->super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    local_158 = -1;
    __val_00 = 0;
    for (pQVar16 = (pmVar10->super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>)._M_impl.
                   super__Vector_impl_data._M_start; pQVar16 != pQVar1; pQVar16 = pQVar16 + 1) {
      pOVar9 = ObjTable<QPDFWriter::Object>::operator[]
                         (&(((this->m).
                             super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->obj).super_ObjTable<QPDFWriter::Object>,*pQVar16);
      __val = pOVar9->renumber;
      if (local_158 == -1) {
        local_158 = __val;
      }
      peVar11 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      if (peVar11->qdf_mode != false) {
        std::__cxx11::to_string((string *)&length,__val);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&extends
                       ,"%% Object stream: object ",(string *)&length);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &obj_to_write,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&extends
                       ,", index ");
        std::__cxx11::to_string(&local_70,__val_00);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pp_ostream,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &obj_to_write,&local_70);
        str._M_str = (char *)pp_ostream.qw;
        str._M_len = pp_ostream.stack_id;
        writeString(this,str);
        std::__cxx11::string::~string((string *)&pp_ostream);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&obj_to_write);
        std::__cxx11::string::~string((string *)&extends);
        std::__cxx11::string::~string((string *)&length);
        if (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            suppress_original_object_ids == false) {
          std::__cxx11::to_string((string *)&obj_to_write,pQVar16->obj);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &pp_ostream,"; original object ID: ",(string *)&obj_to_write);
          str_00._M_str = (char *)pp_ostream.qw;
          str_00._M_len = pp_ostream.stack_id;
          writeString(this,str_00);
          std::__cxx11::string::~string((string *)&pp_ostream);
          std::__cxx11::string::~string((string *)&obj_to_write);
          if (pQVar16->gen != 0) {
            std::__cxx11::to_string((string *)&obj_to_write,pQVar16->gen);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &pp_ostream," ",(string *)&obj_to_write);
            str_01._M_str = (char *)pp_ostream.qw;
            str_01._M_len = pp_ostream.stack_id;
            writeString(this,str_01);
            std::__cxx11::string::~string((string *)&pp_ostream);
            std::__cxx11::string::~string((string *)&obj_to_write);
          }
        }
        str_02._M_str = "\n";
        str_02._M_len = 1;
        writeString(this,str_02);
        peVar11 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
      }
      psVar2 = peVar11->pipeline->str;
      psVar15 = (size_type *)&peVar11->pipeline->count;
      if (psVar2 != (string *)0x0) {
        psVar15 = &psVar2->_M_string_length;
      }
      pp_ostream.qw = (QPDFWriter *)*psVar15;
      std::vector<long_long,_std::allocator<long_long>_>::emplace_back<long_long>
                (&offsets,(longlong *)&pp_ostream);
      peVar11 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      piVar6 = &peVar11->events_seen;
      *piVar6 = *piVar6 + -1;
      QPDF::getObject((QPDF *)&obj_to_write,(QPDFObjGen)peVar11->pdf);
      bVar8 = QPDFObjectHandle::isStream(&obj_to_write);
      if (bVar8) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&pp_ostream,"stream found inside object stream; treating as null",
                   (allocator<char> *)&extends);
        QPDFObjectHandle::warnIfPossible(&obj_to_write,(string *)&pp_ostream);
        std::__cxx11::string::~string((string *)&pp_ostream);
        QPDFObjectHandle::newNull();
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&obj_to_write,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&pp_ostream);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pp_ostream.stack_id);
      }
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_90,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&obj_to_write);
      writeObject(this,(QPDFObjectHandle *)&local_90,__val_00);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
      pNVar12 = ObjTable<QPDFWriter::NewObject>::operator[]
                          (&(((this->m).
                              super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->new_obj).super_ObjTable<QPDFWriter::NewObject>,__val);
      (pNVar12->xref).type = 2;
      (pNVar12->xref).field1 = (long)objid;
      (pNVar12->xref).field2 = __val_00;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&obj_to_write.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      __val_00 = __val_00 + 1;
    }
    PipelinePopper::~PipelinePopper(&pp_ostream_pass1);
    pp_ostream.stack_id = 0;
    pp_ostream.qw = this;
    pvVar13 = std::vector<long_long,_std::allocator<long_long>_>::at(&offsets,0);
    uVar7 = local_130._16_4_;
    lVar3 = *pvVar13;
    for (plVar14 = offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
        plVar14 !=
        offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_finish; plVar14 = plVar14 + 1) {
      *plVar14 = *plVar14 - lVar3;
    }
    obj_to_write.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_118._M_t.super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
    super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
         (__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true>)
         (__uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>)0x0;
    obj_to_write.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    activatePipelineStack(this,(PipelinePopper *)&obj_to_write,true,(string *)0x0,&local_118);
    std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr(&local_118);
    writeObjectStreamOffsets(this,&offsets,local_158);
    pCVar4 = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline;
    psVar2 = pCVar4->str;
    psVar15 = (size_type *)&pCVar4->count;
    if (psVar2 != (string *)0x0) {
      psVar15 = &psVar2->_M_string_length;
    }
    sVar5 = *psVar15;
    PipelinePopper::~PipelinePopper((PipelinePopper *)&obj_to_write);
    if ((char)uVar7 == '\0') {
      activatePipelineStack(this,&pp_ostream,&stream_buffer_pass2);
    }
    else {
      ::qpdf::pl::create<qpdf::pl::String,std::__cxx11::string&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130);
      obj_to_write.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)
               CONCAT44(obj_to_write.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,1);
      ::qpdf::pl::create<Pl_Flate,Pl_Flate::action_e>
                ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)(local_130 + 8)
                 ,(action_e *)local_130);
      activatePipelineStack
                (this,&pp_ostream,
                 (unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)(local_130 + 8)
                );
      std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr
                ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)(local_130 + 8)
                );
      std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr
                ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)local_130);
    }
    writeObjectStreamOffsets(this,&offsets,local_158);
    str_03._M_str = stream_buffer_pass1._M_dataplus._M_p;
    str_03._M_len = stream_buffer_pass1._M_string_length;
    writeString(this,str_03);
    stream_buffer_pass1._M_string_length = 0;
    *stream_buffer_pass1._M_dataplus._M_p = '\0';
    std::__cxx11::string::shrink_to_fit();
    PipelinePopper::~PipelinePopper(&pp_ostream);
    openObject(this,objid);
    setDataKey(this,objid);
    str_04._M_str = "<<";
    str_04._M_len = 2;
    writeString(this,str_04);
    str_05._M_str = "\n ";
    str_05._M_len = 2;
    writeStringQDF(this,str_05);
    str_06._M_str = " /Type /ObjStm";
    str_06._M_len = 0xe;
    writeString(this,str_06);
    str_07._M_str = "\n ";
    str_07._M_len = 2;
    writeStringQDF(this,str_07);
    length = stream_buffer_pass2._M_string_length;
    adjustAESStreamLength(this,&length);
    std::__cxx11::to_string((string *)&obj_to_write,length);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pp_ostream,
                   " /Length ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &obj_to_write);
    str_08._M_str = (char *)pp_ostream.qw;
    str_08._M_len = pp_ostream.stack_id;
    writeString(this,str_08);
    std::__cxx11::string::~string((string *)&pp_ostream);
    std::__cxx11::string::~string((string *)&obj_to_write);
    str_09._M_str = "\n ";
    str_09._M_len = 2;
    writeStringQDF(this,str_09);
    if ((char)uVar7 != '\0') {
      str_10._M_str = " /Filter /FlateDecode";
      str_10._M_len = 0x15;
      writeString(this,str_10);
    }
    std::__cxx11::to_string
              ((string *)&obj_to_write,
               (long)offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pp_ostream,
                   " /N ",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &obj_to_write);
    str_11._M_str = (char *)pp_ostream.qw;
    str_11._M_len = pp_ostream.stack_id;
    writeString(this,str_11);
    std::__cxx11::string::~string((string *)&pp_ostream);
    std::__cxx11::string::~string((string *)&obj_to_write);
    str_12._M_str = "\n ";
    str_12._M_len = 2;
    writeStringQDF(this,str_12);
    std::__cxx11::to_string((string *)&obj_to_write,lVar3 + sVar5);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pp_ostream,
                   " /First ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &obj_to_write);
    str_13._M_str = (char *)pp_ostream.qw;
    str_13._M_len = pp_ostream.stack_id;
    writeString(this,str_13);
    std::__cxx11::string::~string((string *)&pp_ostream);
    std::__cxx11::string::~string((string *)&obj_to_write);
    bVar8 = QPDFObjectHandle::isNull(object);
    if (!bVar8) {
      QPDFObjectHandle::getDict(&obj_to_write);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&pp_ostream,"/Extends",(allocator<char> *)&local_70);
      QPDFObjectHandle::getKey(&extends,(string *)&obj_to_write);
      std::__cxx11::string::~string((string *)&pp_ostream);
      bVar8 = QPDFObjectHandle::isIndirect(&extends);
      if (bVar8) {
        str_14._M_str = "\n ";
        str_14._M_len = 2;
        writeStringQDF(this,str_14);
        str_15._M_str = " /Extends ";
        str_15._M_len = 10;
        writeString(this,str_15);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_a0,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&extends);
        unparseChild(this,(QPDFObjectHandle *)&local_a0,1,4);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&extends.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&obj_to_write.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    str_16._M_str = "\n";
    str_16._M_len = 1;
    writeStringQDF(this,str_16);
    str_17._M_str = " ";
    str_17._M_len = 1;
    writeStringNoQDF(this,str_17);
    str_18._M_str = ">>\nstream\n";
    str_18._M_len = 10;
    writeString(this,str_18);
    pp_ostream.stack_id = 0;
    pp_ostream.qw = this;
    pushEncryptionFilter(this,&pp_ostream);
    str_19._M_str = stream_buffer_pass2._M_dataplus._M_p;
    str_19._M_len = stream_buffer_pass2._M_string_length;
    writeString(this,str_19);
    PipelinePopper::~PipelinePopper(&pp_ostream);
    if (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        newline_before_endstream == true) {
      str_20._M_str = "\n";
      str_20._M_len = 1;
      writeString(this,str_20);
    }
    str_21._M_str = "endstream";
    str_21._M_len = 9;
    writeString(this,str_21);
    peVar11 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (peVar11->cur_data_key)._M_string_length = 0;
    *(peVar11->cur_data_key)._M_dataplus._M_p = '\0';
    closeObject(this,objid);
    std::__cxx11::string::~string((string *)&stream_buffer_pass2);
    std::__cxx11::string::~string((string *)&stream_buffer_pass1);
    std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
              (&offsets.super__Vector_base<long_long,_std::allocator<long_long>_>);
    return;
  }
  __assert_fail("old_og.getGen() == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFWriter.cc"
                ,0x674,"void QPDFWriter::writeObjectStream(QPDFObjectHandle)");
}

Assistant:

void
QPDFWriter::writeObjectStream(QPDFObjectHandle object)
{
    // Note: object might be null if this is a place-holder for an object stream that we are
    // generating from scratch.

    QPDFObjGen old_og = object.getObjGen();
    qpdf_assert_debug(old_og.getGen() == 0);
    int old_id = old_og.getObj();
    int new_stream_id = m->obj[old_og].renumber;

    std::vector<qpdf_offset_t> offsets;
    qpdf_offset_t first = 0;

    // Generate stream itself.  We have to do this in two passes so we can calculate offsets in the
    // first pass.
    std::string stream_buffer_pass1;
    std::string stream_buffer_pass2;
    int first_obj = -1;
    const bool compressed = m->compress_streams && !m->qdf_mode;
    {
        // Pass 1
        PipelinePopper pp_ostream_pass1(this);
        activatePipelineStack(pp_ostream_pass1, stream_buffer_pass1);

        int count = -1;
        for (auto const& obj: m->object_stream_to_objects[old_id]) {
            ++count;
            int new_obj = m->obj[obj].renumber;
            if (first_obj == -1) {
                first_obj = new_obj;
            }
            if (m->qdf_mode) {
                writeString(
                    "%% Object stream: object " + std::to_string(new_obj) + ", index " +
                    std::to_string(count));
                if (!m->suppress_original_object_ids) {
                    writeString("; original object ID: " + std::to_string(obj.getObj()));
                    // For compatibility, only write the generation if non-zero.  While object
                    // streams only allow objects with generation 0, if we are generating object
                    // streams, the old object could have a non-zero generation.
                    if (obj.getGen() != 0) {
                        QTC::TC("qpdf", "QPDFWriter original obj non-zero gen");
                        writeString(" " + std::to_string(obj.getGen()));
                    }
                }
                writeString("\n");
            }

            offsets.push_back(m->pipeline->getCount());
            // To avoid double-counting objects being written in object streams for progress
            // reporting, decrement in pass 1.
            indicateProgress(true, false);

            QPDFObjectHandle obj_to_write = m->pdf.getObject(obj);
            if (obj_to_write.isStream()) {
                // This condition occurred in a fuzz input. Ideally we should block it at parse
                // time, but it's not clear to me how to construct a case for this.
                obj_to_write.warnIfPossible("stream found inside object stream; treating as null");
                obj_to_write = QPDFObjectHandle::newNull();
            }
            writeObject(obj_to_write, count);

            m->new_obj[new_obj].xref = QPDFXRefEntry(new_stream_id, count);
        }
    }
    {
        PipelinePopper pp_ostream(this);
        // Adjust offsets to skip over comment before first object
        first = offsets.at(0);
        for (auto& iter: offsets) {
            iter -= first;
        }

        // Take one pass at writing pairs of numbers so we can get their size information
        {
            PipelinePopper pp_discard(this);
            activatePipelineStack(pp_discard, true);
            writeObjectStreamOffsets(offsets, first_obj);
            first += m->pipeline->getCount();
        }

        // Set up a stream to write the stream data into a buffer.
        if (compressed) {
            activatePipelineStack(
                pp_ostream,
                pl::create<Pl_Flate>(
                    pl::create<pl::String>(stream_buffer_pass2), Pl_Flate::a_deflate));
        } else {
            activatePipelineStack(pp_ostream, stream_buffer_pass2);
        }
        writeObjectStreamOffsets(offsets, first_obj);
        writeString(stream_buffer_pass1);
        stream_buffer_pass1.clear();
        stream_buffer_pass1.shrink_to_fit();
    }

    // Write the object
    openObject(new_stream_id);
    setDataKey(new_stream_id);
    writeString("<<");
    writeStringQDF("\n ");
    writeString(" /Type /ObjStm");
    writeStringQDF("\n ");
    size_t length = stream_buffer_pass2.size();
    adjustAESStreamLength(length);
    writeString(" /Length " + std::to_string(length));
    writeStringQDF("\n ");
    if (compressed) {
        writeString(" /Filter /FlateDecode");
    }
    writeString(" /N " + std::to_string(offsets.size()));
    writeStringQDF("\n ");
    writeString(" /First " + std::to_string(first));
    if (!object.isNull()) {
        // If the original object has an /Extends key, preserve it.
        QPDFObjectHandle dict = object.getDict();
        QPDFObjectHandle extends = dict.getKey("/Extends");
        if (extends.isIndirect()) {
            QTC::TC("qpdf", "QPDFWriter copy Extends");
            writeStringQDF("\n ");
            writeString(" /Extends ");
            unparseChild(extends, 1, f_in_ostream);
        }
    }
    writeStringQDF("\n");
    writeStringNoQDF(" ");
    writeString(">>\nstream\n");
    if (m->encrypted) {
        QTC::TC("qpdf", "QPDFWriter encrypt object stream");
    }
    {
        PipelinePopper pp_enc(this);
        pushEncryptionFilter(pp_enc);
        writeString(stream_buffer_pass2);
    }
    if (m->newline_before_endstream) {
        writeString("\n");
    }
    writeString("endstream");
    m->cur_data_key.clear();
    closeObject(new_stream_id);
}